

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O3

bool leveldb::test::RegisterTest(char *base,char *name,_func_void *func)

{
  undefined8 *puVar1;
  undefined8 *__src;
  undefined8 *puVar2;
  ulong uVar3;
  void *__dest;
  long lVar4;
  size_t __n;
  ulong uVar5;
  ulong uVar6;
  
  if ((anonymous_namespace)::tests == (undefined8 *)0x0) {
    (anonymous_namespace)::tests = (undefined8 *)operator_new(0x18);
    *(anonymous_namespace)::tests = 0;
    (anonymous_namespace)::tests[1] = 0;
    (anonymous_namespace)::tests[2] = 0;
  }
  puVar2 = (anonymous_namespace)::tests;
  puVar1 = (undefined8 *)(anonymous_namespace)::tests[1];
  if (puVar1 == (undefined8 *)(anonymous_namespace)::tests[2]) {
    __src = (undefined8 *)*(anonymous_namespace)::tests;
    __n = (long)puVar1 - (long)__src;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    lVar4 = (long)__n >> 3;
    uVar5 = lVar4 * -0x5555555555555555;
    uVar3 = 1;
    if (puVar1 != __src) {
      uVar3 = uVar5;
    }
    uVar6 = uVar3 + uVar5;
    if (0x555555555555554 < uVar6) {
      uVar6 = 0x555555555555555;
    }
    if (CARRY8(uVar3,uVar5)) {
      uVar6 = 0x555555555555555;
    }
    if (uVar6 == 0) {
      __dest = (void *)0x0;
    }
    else {
      __dest = operator_new(uVar6 * 0x18);
    }
    *(char **)((long)__dest + lVar4 * 8) = base;
    *(char **)((long)__dest + lVar4 * 8 + 8) = name;
    *(_func_void **)((long)__dest + lVar4 * 8 + 0x10) = func;
    if (0 < (long)__n) {
      memmove(__dest,__src,__n);
    }
    if (__src != (undefined8 *)0x0) {
      operator_delete(__src);
    }
    *puVar2 = __dest;
    puVar2[1] = (long)__dest + __n + 0x18;
    puVar2[2] = (void *)((long)__dest + uVar6 * 0x18);
  }
  else {
    *puVar1 = base;
    puVar1[1] = name;
    puVar1[2] = func;
    puVar2[1] = puVar2[1] + 0x18;
  }
  return true;
}

Assistant:

bool RegisterTest(const char* base, const char* name, void (*func)()) {
  if (tests == nullptr) {
    tests = new std::vector<Test>;
  }
  Test t;
  t.base = base;
  t.name = name;
  t.func = func;
  tests->push_back(t);
  return true;
}